

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters_ssse3_intr.c
# Opt level: O0

void ihevc_inter_pred_luma_copy_ssse3
               (UWORD8 *pu1_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 *puVar8;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int in_R9D;
  WORD32 dst3;
  WORD32 dst2;
  WORD32 dst1;
  WORD32 dst0;
  __m128i src3_16x8b;
  __m128i src2_16x8b;
  __m128i src1_16x8b;
  __m128i src0_16x8b;
  WORD32 col;
  WORD32 row;
  int local_2d4;
  int local_2d0;
  undefined8 *local_2b8;
  undefined8 *local_2b0;
  undefined4 local_88;
  undefined4 local_68;
  undefined4 local_48;
  undefined4 local_28;
  
  if (dst1 % 4 != 0) {
    __assert_fail("(wd % 4 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_inter_pred_filters_ssse3_intr.c"
                  ,0x82,
                  "void ihevc_inter_pred_luma_copy_ssse3(UWORD8 *, UWORD8 *, WORD32, WORD32, WORD8 *, WORD32, WORD32)"
                 );
  }
  if (in_R9D % 4 != 0) {
    __assert_fail("(ht % 4 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_inter_pred_filters_ssse3_intr.c"
                  ,0x83,
                  "void ihevc_inter_pred_luma_copy_ssse3(UWORD8 *, UWORD8 *, WORD32, WORD32, WORD8 *, WORD32, WORD32)"
                 );
  }
  local_2b8 = in_RSI;
  local_2b0 = in_RDI;
  if ((dst1 & 0xfU) == 0) {
    for (local_2d0 = 0; local_2d0 < in_R9D; local_2d0 = local_2d0 + 4) {
      for (local_2d4 = 0; local_2d4 < dst1; local_2d4 = local_2d4 + 0x10) {
        uVar1 = local_2b0[1];
        uVar2 = *(undefined8 *)((long)local_2b0 + (long)in_EDX);
        uVar3 = ((undefined8 *)((long)local_2b0 + (long)in_EDX))[1];
        puVar8 = (undefined8 *)((long)local_2b0 + (long)(in_EDX << 1));
        uVar4 = *puVar8;
        uVar5 = puVar8[1];
        puVar8 = (undefined8 *)((long)local_2b0 + (long)(in_EDX * 3));
        uVar6 = *puVar8;
        uVar7 = puVar8[1];
        *local_2b8 = *local_2b0;
        local_2b8[1] = uVar1;
        *(undefined8 *)((long)local_2b8 + (long)in_ECX) = uVar2;
        ((undefined8 *)((long)local_2b8 + (long)in_ECX))[1] = uVar3;
        puVar8 = (undefined8 *)((long)local_2b8 + (long)(in_ECX << 1));
        *puVar8 = uVar4;
        puVar8[1] = uVar5;
        puVar8 = (undefined8 *)((long)local_2b8 + (long)(in_ECX * 3));
        *puVar8 = uVar6;
        puVar8[1] = uVar7;
        local_2b0 = local_2b0 + 2;
        local_2b8 = local_2b8 + 2;
      }
      local_2b0 = (undefined8 *)((long)local_2b0 + (long)(in_EDX * 4 - dst1));
      local_2b8 = (undefined8 *)((long)local_2b8 + (long)(in_ECX * 4 - dst1));
    }
  }
  else if ((dst1 & 7U) == 0) {
    for (local_2d0 = 0; local_2d0 < in_R9D; local_2d0 = local_2d0 + 4) {
      for (local_2d4 = 0; local_2d4 < dst1; local_2d4 = local_2d4 + 8) {
        uVar1 = *(undefined8 *)((long)local_2b0 + (long)in_EDX);
        uVar2 = *(undefined8 *)((long)local_2b0 + (long)(in_EDX * 2));
        uVar3 = *(undefined8 *)((long)local_2b0 + (long)(in_EDX * 3));
        *local_2b8 = *local_2b0;
        *(undefined8 *)((long)local_2b8 + (long)in_ECX) = uVar1;
        *(undefined8 *)((long)local_2b8 + (long)(in_ECX * 2)) = uVar2;
        *(undefined8 *)((long)local_2b8 + (long)(in_ECX * 3)) = uVar3;
        local_2b0 = local_2b0 + 1;
        local_2b8 = local_2b8 + 1;
      }
      local_2b0 = (undefined8 *)((long)local_2b0 + (long)(in_EDX * 4 - dst1));
      local_2b8 = (undefined8 *)((long)local_2b8 + (long)(in_ECX * 4 - dst1));
    }
  }
  else {
    for (local_2d0 = 0; local_2d0 < in_R9D; local_2d0 = local_2d0 + 4) {
      for (local_2d4 = 0; local_2d4 < dst1; local_2d4 = local_2d4 + 4) {
        local_28 = (undefined4)*local_2b0;
        local_48 = (undefined4)*(undefined8 *)((long)local_2b0 + (long)in_EDX);
        local_68 = (undefined4)*(undefined8 *)((long)local_2b0 + (long)(in_EDX * 2));
        local_88 = (undefined4)*(undefined8 *)((long)local_2b0 + (long)(in_EDX * 3));
        *(undefined4 *)local_2b8 = local_28;
        *(undefined4 *)((long)local_2b8 + (long)in_ECX) = local_48;
        *(undefined4 *)((long)local_2b8 + (long)(in_ECX << 1)) = local_68;
        *(undefined4 *)((long)local_2b8 + (long)(in_ECX * 3)) = local_88;
        local_2b0 = (undefined8 *)((long)local_2b0 + 4);
        local_2b8 = (undefined8 *)((long)local_2b8 + 4);
      }
      local_2b0 = (undefined8 *)((long)local_2b0 + (long)(in_EDX * 4 - dst1));
      local_2b8 = (undefined8 *)((long)local_2b8 + (long)(in_ECX * 4 - dst1));
    }
  }
  return;
}

Assistant:

void ihevc_inter_pred_luma_copy_ssse3(UWORD8 *pu1_src,
                                      UWORD8 *pu1_dst,
                                      WORD32 src_strd,
                                      WORD32 dst_strd,
                                      WORD8 *pi1_coeff,
                                      WORD32 ht,
                                      WORD32 wd)
{

    WORD32 row, col;
    __m128i  src0_16x8b, src1_16x8b, src2_16x8b, src3_16x8b;
    UNUSED(pi1_coeff);
    ASSERT(wd % 4 == 0); /* checking assumption*/
    ASSERT(ht % 4 == 0); /* checking assumption*/

/*  outer for loop starts from here */
    if(0 == (wd & 15)) /* wd multiple of 16 case */
    {
        for(row = 0; row < ht; row += 4)
        {
            for(col = 0; col < wd; col += 16)
            {
                /*load 16 pixel values from 15:0 pos. relative to cur. pos.*/
                src0_16x8b = _mm_loadu_si128((__m128i *)(pu1_src));                /* row =0 */
                src1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src + 1 * src_strd)); /* row =1 */
                src2_16x8b = _mm_loadu_si128((__m128i *)(pu1_src + 2 * src_strd)); /* row =2 */
                src3_16x8b = _mm_loadu_si128((__m128i *)(pu1_src + 3 * src_strd)); /* row =3 */

                /* storing 16 8-bit output values */
                _mm_storeu_si128((__m128i *)(pu1_dst), src0_16x8b);                 /* row =0 */
                _mm_storeu_si128((__m128i *)(pu1_dst + 1 * dst_strd), src1_16x8b);  /* row =1 */
                _mm_storeu_si128((__m128i *)(pu1_dst + 2 * dst_strd), src2_16x8b);  /* row =2 */
                _mm_storeu_si128((__m128i *)(pu1_dst + 3 * dst_strd), src3_16x8b);  /* row =3 */

                pu1_src += 16; /* pointer update */
                pu1_dst += 16; /* pointer update */
            } /* inner for loop ends here(16-output values in single iteration) */

            pu1_src += 4 * src_strd - wd; /* pointer update */
            pu1_dst += 4 * dst_strd - wd; /* pointer update */
        }

    }
    else if(0 == (wd & 7)) /* multiple of 8 case */
    {
        for(row = 0; row < ht; row += 4)
        {
            for(col = 0; col < wd; col += 8)
            {
                /*load 16 pixel values from 15:0 pos. relative to cur. pos.*/
                src0_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src));                /* row =0 */
                src1_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 1 * src_strd)); /* row =1 */
                src2_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 2 * src_strd)); /* row =2 */
                src3_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 3 * src_strd)); /* row =3 */

                /* storing 16 8-bit output values */
                _mm_storel_epi64((__m128i *)(pu1_dst), src0_16x8b);                 /* row =0 */
                _mm_storel_epi64((__m128i *)(pu1_dst + 1 * dst_strd), src1_16x8b);  /* row =1 */
                _mm_storel_epi64((__m128i *)(pu1_dst + 2 * dst_strd), src2_16x8b);  /* row =2 */
                _mm_storel_epi64((__m128i *)(pu1_dst + 3 * dst_strd), src3_16x8b);  /* row =3 */

                pu1_src += 8; /* pointer update */
                pu1_dst += 8; /* pointer update */
            } /*  inner for loop ends here(8-output values in single iteration) */

            pu1_src += 4 * src_strd - wd; /* pointer update */
            pu1_dst += 4 * dst_strd - wd; /* pointer update */
        }
    }
    else /* wd = multiple of 4 case */
    {
        WORD32 dst0, dst1, dst2, dst3;
        for(row = 0; row < ht; row += 4)
        {
            for(col = 0; col < wd; col += 4)
            {
                /*load 16 pixel values from 15:0 pos. relative to cur. pos.*/
                src0_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src));                /* row =0 */
                src1_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 1 * src_strd)); /* row =1 */
                src2_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 2 * src_strd)); /* row =2 */
                src3_16x8b = _mm_loadl_epi64((__m128i *)(pu1_src + 3 * src_strd)); /* row =3 */

                dst0 = _mm_cvtsi128_si32(src0_16x8b);
                dst1 = _mm_cvtsi128_si32(src1_16x8b);
                dst2 = _mm_cvtsi128_si32(src2_16x8b);
                dst3 = _mm_cvtsi128_si32(src3_16x8b);

                /* storing 4 8-bit output values */
                *(WORD32 *)(&pu1_dst[0 * dst_strd]) = dst0; /* row =0 */
                *(WORD32 *)(&pu1_dst[1 * dst_strd]) = dst1; /* row =1 */
                *(WORD32 *)(&pu1_dst[2 * dst_strd]) = dst2; /* row =2 */
                *(WORD32 *)(&pu1_dst[3 * dst_strd]) = dst3; /* row =3 */

                pu1_src += 4; /* pointer update */
                pu1_dst += 4; /* pointer update */
            } /*  inner for loop ends here(4- output values in single iteration) */

            pu1_src += 4 * src_strd - wd; /* pointer update */
            pu1_dst += 4 * dst_strd - wd; /* pointer update */
        }
    }
}